

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O1

char * __thiscall glcts::TessellationShaderBarrier3::getTCSCode(TessellationShaderBarrier3 *this)

{
  return 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 16) out;\n\n      out int tcs_data        [];\npatch out int tcs_patch_result[16];\n\nvoid main()\n{\n    if ((gl_InvocationID % 2) == 0)\n    {\n        tcs_data[gl_InvocationID] = gl_InvocationID;\n    }\n\n    barrier();\n\n    if ((gl_InvocationID % 2) == 1)\n    {\n        tcs_data[gl_InvocationID] = tcs_data[gl_InvocationID - 1] + gl_InvocationID;\n    }\n\n    barrier();\n\n    tcs_patch_result[gl_InvocationID] = 0;\n\n    if ((gl_InvocationID % 4) == 0)\n    {\n        tcs_patch_result[gl_InvocationID] += tcs_data[gl_InvocationID];\n        tcs_patch_result[gl_InvocationID] += tcs_data[gl_InvocationID+1];\n        tcs_patch_result[gl_InvocationID] += tcs_data[gl_InvocationID+2];\n        tcs_patch_result[gl_InvocationID] += tcs_data[gl_InvocationID+3];\n    }\n\n    gl_TessLevelOuter[0] = 1.0;\n    gl_TessLevelOuter[1] = 1.0;\n}\n"
  ;
}

Assistant:

const char* TessellationShaderBarrier3::getTCSCode()
{
	static const char* tcs_code =
		"${VERSION}\n"
		"\n"
		"${TESSELLATION_SHADER_REQUIRE}\n"
		"\n"
		"layout (vertices = 16) out;\n"
		"\n"
		"      out int tcs_data        [];\n"
		"patch out int tcs_patch_result[16];\n"
		"\n"
		"void main()\n"
		"{\n"
		/* Even invocations should write their gl_InvocationID value to their per-vertex output. */
		"    if ((gl_InvocationID % 2) == 0)\n"
		"    {\n"
		"        tcs_data[gl_InvocationID] = gl_InvocationID;\n"
		"    }\n"
		"\n"
		"    barrier();\n"
		"\n"
		/* Odd invocations should read values stored by preceding even invocation,
		 * add current invocation's ID to that value, and then write it to its per-vertex
		 * output.
		 */
		"    if ((gl_InvocationID % 2) == 1)\n"
		"    {\n"
		"        tcs_data[gl_InvocationID] = tcs_data[gl_InvocationID - 1] + gl_InvocationID;\n"
		"    }\n"
		"\n"
		"    barrier();\n"
		"\n"
		/* Every fourth invocation should now read & sum up per-vertex outputs for four invocations
		 * following it (including the one discussed), and store it in a per-patch variable */
		"    tcs_patch_result[gl_InvocationID] = 0;\n"
		"\n"
		"    if ((gl_InvocationID % 4) == 0)\n"
		"    {\n"
		"        tcs_patch_result[gl_InvocationID] += tcs_data[gl_InvocationID];\n"
		"        tcs_patch_result[gl_InvocationID] += tcs_data[gl_InvocationID+1];\n"
		"        tcs_patch_result[gl_InvocationID] += tcs_data[gl_InvocationID+2];\n"
		"        tcs_patch_result[gl_InvocationID] += tcs_data[gl_InvocationID+3];\n"
		"    }\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"}\n";

	return tcs_code;
}